

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

string * __thiscall
pfederc::Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this,Lexer *lexer)

{
  char *pcVar1;
  char *pcVar2;
  
  if (this->type == TOK_KW_TRUE) {
    pcVar1 = "";
    pcVar2 = "True";
  }
  else {
    if (this->type != TOK_KW_FALSE) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&lexer->fileContent);
      return __return_storage_ptr__;
    }
    pcVar1 = "";
    pcVar2 = "False";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::toString(const Lexer &lexer) const noexcept {
	switch(getType()) {
	case TokenType::TOK_KW_TRUE:
		return "True";
	case TokenType::TOK_KW_FALSE:
		return "False";
	default:
  	return lexer.getFileContent().substr(getPosition().startIndex,
  	  getPosition().endIndex - getPosition().startIndex + 1);
	}
}